

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

void llvm::APInt::sdivrem(APInt *LHS,int64_t RHS,APInt *Quotient,int64_t *Remainder)

{
  bool bVar1;
  ulong uVar2;
  uint64_t R;
  uint64_t local_60;
  anon_union_8_2_1313ab2f_for_U local_58;
  uint local_50;
  anon_union_8_2_1313ab2f_for_U local_48;
  uint local_40;
  anon_union_8_2_1313ab2f_for_U local_38;
  uint local_30;
  
  local_60 = *Remainder;
  bVar1 = operator[](LHS,LHS->BitWidth - 1);
  if (bVar1) {
    if (RHS < 0) {
      local_40 = LHS->BitWidth;
      if ((ulong)local_40 < 0x41) {
        local_48 = LHS->U;
      }
      else {
        uVar2 = (ulong)((uint)((ulong)local_40 + 0x3f >> 3) & 0xfffffff8);
        local_48.pVal = (uint64_t *)operator_new__(uVar2);
        memcpy(local_48.pVal,(LHS->U).pVal,uVar2);
      }
      flipAllBits((APInt *)&local_48);
      operator++((APInt *)&local_48);
      local_30 = local_40;
      local_38.VAL = local_48.VAL;
      local_40 = 0;
      udivrem((APInt *)&local_38,-RHS,Quotient,&local_60);
      if ((0x40 < local_30) && (local_38.VAL != 0)) {
        operator_delete__(local_38.pVal);
      }
      if ((0x40 < local_40) && (local_48.VAL != 0)) {
        operator_delete__(local_48.pVal);
      }
    }
    else {
      local_50 = LHS->BitWidth;
      if ((ulong)local_50 < 0x41) {
        local_58 = LHS->U;
      }
      else {
        uVar2 = (ulong)((uint)((ulong)local_50 + 0x3f >> 3) & 0xfffffff8);
        local_58.pVal = (uint64_t *)operator_new__(uVar2);
        memcpy(local_58.pVal,(LHS->U).pVal,uVar2);
      }
      flipAllBits((APInt *)&local_58);
      operator++((APInt *)&local_58);
      local_30 = local_50;
      local_38.VAL = local_58.VAL;
      local_50 = 0;
      udivrem((APInt *)&local_38,RHS,Quotient,&local_60);
      if ((0x40 < local_30) && (local_38.VAL != 0)) {
        operator_delete__(local_38.pVal);
      }
      if ((0x40 < local_50) && (local_58.VAL != 0)) {
        operator_delete__(local_58.pVal);
      }
      flipAllBits(Quotient);
      operator++(Quotient);
    }
    local_60 = -local_60;
  }
  else if (RHS < 0) {
    udivrem(LHS,-RHS,Quotient,&local_60);
    flipAllBits(Quotient);
    operator++(Quotient);
  }
  else {
    udivrem(LHS,RHS,Quotient,&local_60);
  }
  *Remainder = local_60;
  return;
}

Assistant:

void APInt::sdivrem(const APInt &LHS, int64_t RHS,
                    APInt &Quotient, int64_t &Remainder) {
  uint64_t R = Remainder;
  if (LHS.isNegative()) {
    if (RHS < 0)
      APInt::udivrem(-LHS, -RHS, Quotient, R);
    else {
      APInt::udivrem(-LHS, RHS, Quotient, R);
      Quotient.negate();
    }
    R = -R;
  } else if (RHS < 0) {
    APInt::udivrem(LHS, -RHS, Quotient, R);
    Quotient.negate();
  } else {
    APInt::udivrem(LHS, RHS, Quotient, R);
  }
  Remainder = R;
}